

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

void process_text(CHAR_DATA *ch,char *text)

{
  PC_DATA *pPVar1;
  DO_FUN *pDVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  char *pcVar11;
  char tbuf [4608];
  char obuf [9216];
  char rbuf [4608];
  char local_4838 [4608];
  char local_3638 [9216];
  char local_1238 [4616];
  
  bVar3 = str_cmp(text,"");
  if (!bVar3) {
    return;
  }
  bVar3 = str_cmp(text,"exit");
  if (bVar3) {
    bVar3 = str_cmp(text,"finish");
    if (!bVar3) {
      send_to_char("Saving changes and exiting...\n\r",ch);
      pDVar2 = ch->pcdata->end_fun;
      if (pDVar2 != (DO_FUN *)0x0) {
        (*pDVar2)(ch,ch->pcdata->entered_text);
      }
      pPVar1 = ch->pcdata;
      pPVar1->entering_text = false;
      pPVar1->end_fun = (DO_FUN *)0x0;
      return;
    }
    bVar3 = str_cmp(text,"backline");
    if (bVar3) {
      bVar3 = str_cmp(text,"show");
      if (bVar3) {
        if (*text != '\0') {
          local_3638[0] = '\0';
          sVar6 = strlen(text);
          if (0x50 < sVar6) {
            strcpy(local_4838,text);
            sVar6 = strlen(text);
            if (0x4f < sVar6) {
              uVar9 = 1;
              do {
                iVar5 = (int)uVar9;
                uVar8 = iVar5 * 0x50;
                uVar4 = uVar8;
                if (uVar8 != 0) {
                  uVar7 = uVar8;
                  do {
                    uVar4 = uVar7;
                    if (local_4838[uVar7] == ' ') break;
                    uVar7 = uVar7 - 1;
                    uVar4 = uVar8;
                  } while (iVar5 * 0x50 - 0xfU < uVar7);
                }
                cVar10 = local_4838[uVar4 + 1];
                uVar8 = uVar4;
                if (cVar10 != '\0') {
                  uVar7 = 0;
                  do {
                    local_1238[uVar7] = cVar10;
                    cVar10 = local_4838[uVar8 + 2];
                    uVar8 = uVar8 + 1;
                    uVar7 = uVar7 + 1;
                  } while (cVar10 != '\0');
                }
                local_1238[uVar8 - uVar4] = '\0';
                local_4838[uVar4] = '\n';
                local_4838[uVar4 + 1] = '\r';
                local_4838[uVar4 + 2] = '\0';
                strcat(local_4838,local_1238);
                uVar9 = (ulong)(iVar5 + 1);
              } while (uVar9 <= sVar6 / 0x50);
            }
            send_to_char("Over 80 characters, wrapping line.\n\r",ch);
          }
          pPVar1 = ch->pcdata;
          pcVar11 = pPVar1->entered_text;
          if (pcVar11 != (char *)0x0) {
            strcat(local_3638,pcVar11);
          }
          sVar6 = strlen(text);
          if (sVar6 < 0x50) {
            uVar9 = 0;
            do {
              if (text[uVar9] == '~') goto LAB_0027a734;
              uVar8 = (int)uVar9 + 1;
              uVar9 = (ulong)uVar8;
            } while (uVar8 <= (uint)sVar6);
            strcat(local_3638,text);
          }
          else {
            strcat(local_3638,local_4838);
            sVar6 = strlen(local_4838);
            uVar8 = 1;
            uVar9 = 0;
            do {
              if (local_4838[uVar9] == '~') goto LAB_0027a734;
              uVar9 = (ulong)uVar8;
              uVar8 = uVar8 + 1;
            } while (uVar9 <= sVar6);
          }
          sVar6 = strlen(local_3638);
          (local_3638 + sVar6)[0] = '\n';
          (local_3638 + sVar6)[1] = '\r';
          local_3638[sVar6 + 2] = '\0';
          sVar6 = strlen(local_3638);
          if (sVar6 < 0x2400) {
            free_pstring(pPVar1->entered_text);
            pcVar11 = palloc_string(local_3638);
            ch->pcdata->entered_text = pcVar11;
            pcVar11 = "Line added.";
          }
          else {
            pcVar11 = "String exceeds buffer.\n\r";
          }
          goto LAB_0027a7a5;
        }
        pcVar11 = "Add what?";
      }
      else {
        pcVar11 = ch->pcdata->entered_text;
      }
    }
    else {
      pPVar1 = ch->pcdata;
      pcVar11 = pPVar1->entered_text;
      if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
        strcpy(local_3638,pcVar11);
        uVar9 = strlen(local_3638);
        if ((int)uVar9 != 0) {
          bVar3 = false;
          do {
            iVar5 = (int)uVar9;
            if (local_3638[uVar9 & 0xffffffff] == '\r') {
              if (bVar3) {
                local_3638[iVar5 + 1] = '\0';
                free_pstring(pPVar1->entered_text);
                pcVar11 = palloc_string(local_3638);
                ch->pcdata->entered_text = pcVar11;
                pcVar11 = "Line deleted.";
                goto LAB_0027a7a5;
              }
              iVar5 = iVar5 + -1;
              bVar3 = true;
            }
            uVar9 = (ulong)(iVar5 - 1U);
          } while (iVar5 - 1U != 0);
        }
        local_3638[0] = '\0';
        free_pstring(pPVar1->entered_text);
        pcVar11 = palloc_string(local_3638);
        ch->pcdata->entered_text = pcVar11;
        send_to_char("Line deleted.",ch);
        pcVar11 = ch->pcdata->entered_text;
        goto LAB_0027a7a5;
      }
      pcVar11 = "No lines left to remove.";
    }
  }
  else {
    pPVar1 = ch->pcdata;
    pPVar1->entering_text = false;
    *pPVar1->entered_text = '\0';
    ch->pcdata->end_fun = (DO_FUN *)0x0;
    pcVar11 = "Exiting without saving changes.\n\r";
  }
  send_to_char(pcVar11,ch);
  return;
LAB_0027a734:
  pcVar11 = "Tilde found, line will not be added.\n\r";
LAB_0027a7a5:
  send_to_char(pcVar11,ch);
  return;
}

Assistant:

void process_text(CHAR_DATA *ch, char *text)
{
	char obuf[MSL * 2], tbuf[MSL], rbuf[MSL];
	bool found= false;
	unsigned int len, rcount, i, iloc;

	if (!str_cmp(text, ""))
		return;

	if (!str_cmp(text, "exit"))
	{
		ch->pcdata->entering_text= false;
		ch->pcdata->entered_text[0] = '\0';
		ch->pcdata->end_fun = nullptr;

		send_to_char("Exiting without saving changes.\n\r", ch);
		return;
	}

	if (!str_cmp(text, "finish"))
	{
		send_to_char("Saving changes and exiting...\n\r", ch);

		if (ch->pcdata->end_fun)
			(*ch->pcdata->end_fun)(ch, ch->pcdata->entered_text);

		ch->pcdata->entering_text= false;
		ch->pcdata->end_fun = nullptr;
		return;
	}

	if (!str_cmp(text, "backline"))
	{
		if (ch->pcdata->entered_text == nullptr || ch->pcdata->entered_text[0] == '\0')
		{
			send_to_char("No lines left to remove.", ch);
			return;
		}

		strcpy(obuf, ch->pcdata->entered_text);

		for (len = strlen(obuf); len > 0; len--)
		{
			if (obuf[len] == '\r')
			{
				if (!found)
				{
					if (len > 0)
						len--;

					found = true;
				}
				else
				{
					obuf[len + 1] = '\0';

					free_pstring(ch->pcdata->entered_text);
					ch->pcdata->entered_text = palloc_string(obuf);

					send_to_char("Line deleted.", ch);
					return;
				}
			}
		}

		obuf[0] = '\0';

		free_pstring(ch->pcdata->entered_text);
		ch->pcdata->entered_text = palloc_string(obuf);

		send_to_char("Line deleted.", ch);
		send_to_char(ch->pcdata->entered_text, ch);
		return;
	}

	if (!str_cmp(text, "show"))
	{
		send_to_char(ch->pcdata->entered_text, ch);
		return;
	}

	if (text[0] != '\0')
	{
		obuf[0] = '\0';

		if (strlen(text) > 80)
		{
			sprintf(tbuf, "%s", text);

			for (i = 1; i <= strlen(text) / 80; i++)
			{
				for (rcount = 80 * i; rcount > (80 * i) - 15; rcount--)
				{
					if (tbuf[rcount] == ' ')
						break;
				}

				if (rcount <= (80 * i) - 15)
					rcount = 80 * i;

				for (iloc = rcount; tbuf[iloc + 1]; iloc++)
				{
					rbuf[iloc - rcount] = tbuf[iloc + 1];
				}

				rbuf[iloc - rcount] = '\0';
				tbuf[rcount] = '\n';
				tbuf[rcount + 1] = '\r';
				tbuf[rcount + 2] = '\0';
				strcat(tbuf, rbuf);
			}

			send_to_char("Over 80 characters, wrapping line.\n\r", ch);
		}

		if (ch->pcdata->entered_text)
			strcat(obuf, ch->pcdata->entered_text);

		if (strlen(text) < 80)
		{
			for (i = 0; i <= strlen(text); i++)
			{
				if (text[i] == '~')
				{
					send_to_char("Tilde found, line will not be added.\n\r", ch);
					return;
				}
			}

			strcat(obuf, text);
		}
		else
		{
			strcat(obuf, tbuf);

			for (i = 0; i <= strlen(tbuf); i++)
			{
				if (tbuf[i] == '~')
				{
					send_to_char("Tilde found, line will not be added.\n\r", ch);
					return;
				}
			}
		}

		strcat(obuf, "\n\r");

		if (strlen(obuf) >= MSL * 2)
		{
			send_to_char("String exceeds buffer.\n\r", ch);
			return;
		}

		free_pstring(ch->pcdata->entered_text);
		ch->pcdata->entered_text = palloc_string(obuf);
	}
	else if (text[0] == '\0')
	{
		send_to_char("Add what?", ch);
		return;
	}

	send_to_char("Line added.", ch);
	return;
}